

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O3

void __thiscall QTabBar::mouseDoubleClickEvent(QTabBar *this,QMouseEvent *event)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  char cVar4;
  long in_FS_OFFSET;
  double dVar5;
  undefined1 auVar6 [16];
  QPoint local_48;
  int local_3c;
  void *local_38;
  int *local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  auVar6 = QEventPoint::position();
  dVar5 = (double)((ulong)auVar6._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar6._0_8_;
  bVar3 = 2147483647.0 < dVar5;
  if (dVar5 <= -2147483648.0) {
    dVar5 = -2147483648.0;
  }
  local_48.xp.m_i =
       (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 | ~-(ulong)bVar3 & (ulong)dVar5);
  dVar5 = (double)((ulong)auVar6._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar6._8_8_;
  bVar3 = 2147483647.0 < dVar5;
  if (dVar5 <= -2147483648.0) {
    dVar5 = -2147483648.0;
  }
  local_48.yp.m_i =
       (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 | ~-(ulong)bVar3 & (ulong)dVar5);
  lVar2 = *(long *)(*(long *)(lVar1 + 0x290) + 0x20);
  if ((*(byte *)(lVar2 + 10) & 1) == 0) {
    cVar4 = QRect::contains((QPoint *)(lVar2 + 0x14),SUB81(&local_48,0));
    if (cVar4 != '\0') goto LAB_0048f367;
  }
  lVar1 = *(long *)(*(long *)(lVar1 + 0x288) + 0x20);
  if ((*(byte *)(lVar1 + 10) & 1) == 0) {
    cVar4 = QRect::contains((QPoint *)(lVar1 + 0x14),SUB81(&local_48,0));
    if (cVar4 != '\0') goto LAB_0048f367;
  }
  local_3c = tabAt(this,&local_48);
  local_30 = &local_3c;
  local_38 = (void *)0x0;
  QMetaObject::activate((QObject *)this,&staticMetaObject,4,&local_38);
LAB_0048f367:
  (**(code **)(*(long *)&this->super_QWidget + 0x98))(this,event);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTabBar::mouseDoubleClickEvent(QMouseEvent *event)
{
    Q_D(QTabBar);
    const QPoint pos = event->position().toPoint();
    const bool isEventInCornerButtons = (!d->leftB->isHidden() && d->leftB->geometry().contains(pos))
                                        || (!d->rightB->isHidden() && d->rightB->geometry().contains(pos));
    if (!isEventInCornerButtons)
        emit tabBarDoubleClicked(tabAt(pos));

    mousePressEvent(event);
}